

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O2

int __thiscall zmq::stream_engine_base_t::write_credential(stream_engine_base_t *this,msg_t *msg_)

{
  int iVar1;
  int iVar2;
  blob_t *pbVar3;
  void *__dest;
  int *piVar4;
  char *errmsg_;
  msg_t msg;
  
  iVar2 = (int)&msg;
  if (this->_mechanism == (mechanism_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_mechanism != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x259);
    fflush(_stderr);
    zmq_abort("_mechanism != NULL");
  }
  if (this->_session == (session_base_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_session != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x25a);
    fflush(_stderr);
    zmq_abort("_session != NULL");
  }
  pbVar3 = mechanism_t::get_user_id(this->_mechanism);
  if (pbVar3->_size != 0) {
    iVar1 = msg_t::init_size(&msg,pbVar3->_size);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
              ,0x260);
      fflush(_stderr);
      zmq_abort("rc == 0");
    }
    __dest = msg_t::data(&msg);
    memcpy(__dest,pbVar3->_data,pbVar3->_size);
    msg_t::set_flags(&msg,' ');
    iVar1 = (*(this->_session->super_own_t).super_object_t._vptr_object_t[0x1d])();
    if (iVar1 == -1) {
      iVar2 = msg_t::close(&msg,iVar2);
      if (iVar2 != 0) {
        piVar4 = __errno_location();
        errmsg_ = strerror(*piVar4);
        fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
                ,0x266);
        fflush(_stderr);
        zmq_abort(errmsg_);
      }
      return -1;
    }
  }
  this->_process_msg = 0x69;
  *(undefined8 *)&this->field_0x560 = 0;
  iVar2 = (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xd])(this,msg_);
  return iVar2;
}

Assistant:

int zmq::stream_engine_base_t::write_credential (msg_t *msg_)
{
    zmq_assert (_mechanism != NULL);
    zmq_assert (_session != NULL);

    const blob_t &credential = _mechanism->get_user_id ();
    if (credential.size () > 0) {
        msg_t msg;
        int rc = msg.init_size (credential.size ());
        zmq_assert (rc == 0);
        memcpy (msg.data (), credential.data (), credential.size ());
        msg.set_flags (msg_t::credential);
        rc = _session->push_msg (&msg);
        if (rc == -1) {
            rc = msg.close ();
            errno_assert (rc == 0);
            return -1;
        }
    }
    _process_msg = &stream_engine_base_t::decode_and_push;
    return decode_and_push (msg_);
}